

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  decimal_fp<float> dVar4;
  char *message;
  ulong __n;
  decimal_fp<double> dVar5;
  
  if (value < (longdouble)0) {
    message = "value is negative";
    iVar1 = 0x980;
LAB_00121977:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                ,iVar1,message);
  }
  if (value <= (longdouble)0) {
    if (precision < 1 || ((ulong)specs & 0xff00000000) != 0x200000000) {
      sVar2 = buf->size_;
      uVar3 = sVar2 + 1;
      if (buf->capacity_ < uVar3) {
        (**buf->_vptr_buffer)(buf);
        sVar2 = buf->size_;
        uVar3 = sVar2 + 1;
      }
      buf->size_ = uVar3;
      iVar1 = 0;
      buf->ptr_[sVar2] = '0';
    }
    else {
      uVar3 = buf->capacity_;
      __n = (ulong)(uint)precision;
      if (uVar3 < __n) {
        (**buf->_vptr_buffer)(buf,__n);
        uVar3 = buf->capacity_;
      }
      if (__n <= uVar3) {
        uVar3 = __n;
      }
      buf->size_ = uVar3;
      memset(buf->ptr_,0x30,__n);
      iVar1 = -precision;
    }
  }
  else if ((specs._4_4_ >> 0x13 & 1) == 0) {
    iVar1 = snprintf_float<long_double>(value,precision,specs,buf);
  }
  else {
    if (-1 < precision) {
      message = "";
      iVar1 = 0x5ec;
      goto LAB_00121977;
    }
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      dVar5 = dragonbox::to_decimal<double>((double)value);
      iVar1 = dVar5.exponent;
      write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>
                ((buffer_appender<char>)buf,dVar5.significand);
    }
    else {
      dVar4 = dragonbox::to_decimal<float>((float)value);
      iVar1 = dVar4.exponent;
      write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                ((buffer_appender<char>)buf,dVar4.significand);
    }
  }
  return iVar1;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}